

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O3

void __thiscall
cppcms::url_mapper::real_assign(url_mapper *this,string *key,string *url,application *child)

{
  char *pcVar1;
  pointer pcVar2;
  string *__rhs;
  application *paVar3;
  size_type sVar4;
  iterator iVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  _Base_ptr *pp_Var6;
  runtime_error *prVar7;
  undefined8 *puVar8;
  uint uVar9;
  char *pcVar10;
  _Base_ptr *pp_Var11;
  string *psVar12;
  char *pcVar13;
  data *pdVar14;
  char *pcVar15;
  char *pcVar16;
  string hkey;
  int index;
  entry e;
  uint local_fc;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [16];
  url_mapper *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  uint local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<int,_std::allocator<int>_> vStack_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  application *paStack_50;
  string *local_40;
  application *local_38;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paStack_50 = (application *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar10 = (url->_M_dataplus)._M_p;
  sVar4 = url->_M_string_length;
  pcVar13 = pcVar10;
  pcVar15 = pcVar10;
  local_c8 = this;
  local_40 = key;
  local_38 = child;
  if (sVar4 == 0) {
    local_fc = 0;
LAB_001dbed3:
    paVar3 = local_38;
    if ((local_38 != (application *)0x0) && (local_fc != 1)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30,pcVar15);
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,
                 "cppcms::url_mapper the application mapping should use only 1 parameter","");
      booster::runtime_error::runtime_error(prVar7,(string *)local_f8);
      *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
      (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
      __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_f8,pcVar15,pcVar13);
    __rhs = local_40;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_);
    }
    paStack_50 = paVar3;
    pdVar14 = (local_c8->d).ptr_;
    if (paVar3 == (application *)0x0) {
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (char *)0x0;
      pcVar2 = (__rhs->_M_dataplus)._M_p;
      local_e8._M_allocated_capacity = (size_type)local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_f8 + 0x10),pcVar2,pcVar2 + __rhs->_M_string_length);
      iVar5 = std::
              _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              ::find(&(pdVar14->by_key)._M_t,(key_type *)local_f8);
      if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity);
      }
      pdVar14 = (local_c8->d).ptr_;
      if (((_Rb_tree_header *)iVar5._M_node != &(pdVar14->by_key)._M_t._M_impl.super__Rb_tree_header
          ) && (pp_Var11 = *(_Base_ptr **)(iVar5._M_node + 3), pp_Var11 != (_Base_ptr *)0x0)) {
        pp_Var6 = &iVar5._M_node[2]._M_right;
        do {
          if (pp_Var11[4] != (_Base_ptr)0x0) {
            pp_Var6 = pp_Var11;
          }
          pp_Var11 = (_Base_ptr *)pp_Var11[(ulong)(pp_Var11[4] == (_Base_ptr)0x0) + 2];
        } while (pp_Var11 != (_Base_ptr *)0x0);
        if (((pp_Var6 != &iVar5._M_node[2]._M_right) && (pp_Var6[4] < 2)) &&
           (pp_Var6[0xe] != (_Base_ptr)0x0)) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::operator+(&local_c0,"cppcms::url_mapper: ordinary url key `",__rhs);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
          local_f8._0_8_ = *puVar8;
          psVar12 = (string *)(puVar8 + 2);
          if ((string *)local_f8._0_8_ == psVar12) {
            local_e8._M_allocated_capacity = *(undefined8 *)psVar12;
            local_e8._8_8_ = puVar8[3];
            local_f8._0_8_ = (string *)(local_f8 + 0x10);
          }
          else {
            local_e8._M_allocated_capacity = *(undefined8 *)psVar12;
          }
          local_f8._8_8_ = puVar8[1];
          *puVar8 = psVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          booster::runtime_error::runtime_error(prVar7,(string *)local_f8);
          *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
          (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
          __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
    }
    else {
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (char *)0x0;
      pcVar2 = (__rhs->_M_dataplus)._M_p;
      local_e8._M_allocated_capacity = (size_type)local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_f8 + 0x10),pcVar2,pcVar2 + __rhs->_M_string_length);
      iVar5 = std::
              _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              ::find(&(pdVar14->by_key)._M_t,(key_type *)local_f8);
      pdVar14 = (local_c8->d).ptr_;
      if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity);
      }
      if ((_Rb_tree_header *)iVar5._M_node != &(pdVar14->by_key)._M_t._M_impl.super__Rb_tree_header)
      {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_c0,"cppcms::url_mapper: mounted application key `",__rhs);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_f8._0_8_ = *puVar8;
        psVar12 = (string *)(puVar8 + 2);
        if ((string *)local_f8._0_8_ == psVar12) {
          local_e8._M_allocated_capacity = *(undefined8 *)psVar12;
          local_e8._8_8_ = puVar8[3];
          local_f8._0_8_ = (string *)(local_f8 + 0x10);
        }
        else {
          local_e8._M_allocated_capacity = *(undefined8 *)psVar12;
        }
        local_f8._8_8_ = puVar8[1];
        *puVar8 = psVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        booster::runtime_error::runtime_error(prVar7,(string *)local_f8);
        *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
        (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
        __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      pdVar14 = (local_c8->d).ptr_;
    }
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (char *)0x0;
    pcVar2 = (__rhs->_M_dataplus)._M_p;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0x10),pcVar2,pcVar2 + __rhs->_M_string_length);
    this_00 = std::
              map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              ::operator[](&pdVar14->by_key,(key_type *)local_f8);
    local_c0._M_dataplus._M_p = (pointer)(ulong)local_fc;
    this_01 = std::
              map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
              ::operator[](this_00,(key_type *)&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_01->parts,&local_98);
    std::vector<int,_std::allocator<int>_>::operator=(&this_01->indexes,&vStack_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_01->keys,&local_68);
    this_01->child = paStack_50;
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if (vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    return;
  }
  pcVar1 = local_f8 + 0x10;
  local_fc = 0;
LAB_001dbd0c:
  pcVar16 = pcVar13;
  if (*pcVar13 == '{') {
    local_f8._0_8_ = pcVar1;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_f8,pcVar15,pcVar13);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    if ((char *)local_f8._0_8_ != pcVar1) {
      operator_delete((void *)local_f8._0_8_);
    }
    pcVar10 = (url->_M_dataplus)._M_p;
    sVar4 = url->_M_string_length;
    for (; pcVar16 != pcVar10 + sVar4; pcVar16 = pcVar16 + 1) {
      if (*pcVar16 == '}') {
        local_f8._0_8_ = pcVar1;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_f8,pcVar13 + 1,pcVar16);
        if ((char *)local_f8._8_8_ == (char *)0x0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"cppcms::url_mapper: empty index between {}","");
          booster::runtime_error::runtime_error(prVar7,&local_c0);
          *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
          (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
          __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        pcVar13 = pcVar16 + 1;
        uVar9 = 0;
        goto LAB_001dbda8;
      }
    }
    goto LAB_001dbea3;
  }
  if (*pcVar13 == '}') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"cppcms::url_mapper: \'}\' in url without \'{\'","");
    booster::runtime_error::runtime_error(prVar7,(string *)local_f8);
    *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
    (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
    __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  goto LAB_001dbeb6;
  while (uVar9 = uVar9 + 1, (byte)(*(char *)(local_f8._0_8_ + (long)pcVar10) - 0x30U) < 10) {
LAB_001dbda8:
    pcVar10 = (char *)(ulong)uVar9;
    if ((ulong)local_f8._8_8_ <= pcVar10) {
      local_9c = atoi((char *)local_f8._0_8_);
      if (local_9c == 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"cppcms::url_mapper: index 0 is invalid","");
        booster::runtime_error::runtime_error(prVar7,&local_c0);
        *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
        (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
        __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      if ((int)local_fc < (int)local_9c) {
        local_fc = local_9c;
      }
      if (vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&vStack_80,
                   (iterator)
                   vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_9c);
      }
      else {
        *vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_9c;
        vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&local_68,
               ((long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      goto LAB_001dbe8b;
    }
  }
  local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffff00000000;
  if (vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&vStack_80,
               (iterator)
               vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_c0);
  }
  else {
    *vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
LAB_001dbe8b:
  if ((char *)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_);
  }
  pcVar10 = (url->_M_dataplus)._M_p;
  sVar4 = url->_M_string_length;
LAB_001dbea3:
  pcVar15 = pcVar13;
  if (pcVar16 == pcVar10 + sVar4) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"cppcms::url_mapper: \'{\' in url without \'}\'","");
    booster::runtime_error::runtime_error(prVar7,(string *)local_f8);
    *(undefined ***)prVar7 = &PTR__runtime_error_00284840;
    (prVar7->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
    __cxa_throw(prVar7,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
LAB_001dbeb6:
  pcVar13 = pcVar16 + 1;
  if (pcVar13 == pcVar10 + sVar4) goto LAB_001dbed3;
  goto LAB_001dbd0c;
}

Assistant:

void url_mapper::real_assign(std::string const &key,std::string const &url,application *child)
	{

		data::entry e;
		std::string::const_iterator prev = url.begin(), p = url.begin();

		int max_index = 0;

		while(p!=url.end()) {
			if(*p=='{') {
				e.parts.push_back(std::string(prev,p));
				prev = p;
				while(p!=url.end()) {
					if(*p=='}') {
						std::string const hkey(prev+1,p);
						prev = p+1;
						if(hkey.size()==0) {
							throw cppcms_error("cppcms::url_mapper: empty index between {}");
						}
						bool all_digits = true;
						for(unsigned i=0;all_digits && i<hkey.size();i++) {
							if(hkey[i] < '0' || '9' <hkey[i])
								all_digits = false;
						}
						if(!all_digits) {
							e.indexes.push_back(0);
							e.keys.push_back(hkey);
						}
						else {
							int index = atoi(hkey.c_str());
							if(index == 0)
								throw cppcms_error("cppcms::url_mapper: index 0 is invalid");
							max_index = std::max(index,max_index);
							e.indexes.push_back(index);
							e.keys.resize(e.keys.size()+1);
						}
						break;
					}
					else
						p++;
				}
				if(p==url.end())
					throw cppcms_error("cppcms::url_mapper: '{' in url without '}'");
				p++;
			}
			else if(*p=='}') {
				throw cppcms_error("cppcms::url_mapper: '}' in url without '{'");
			}
			else
				p++;
		}
		if(child && max_index!=1) {
			throw cppcms_error("cppcms::url_mapper the application mapping should use only 1 parameter");
		}
		e.parts.push_back(std::string(prev,p));

		e.child = child;

		if(child) {
			if(d->by_key.find(key)!=d->by_key.end()) 
				throw cppcms_error(	"cppcms::url_mapper: mounted application key `" + key +
							"' can't be shared with ordinary url key");
		}
		else {
			data::by_key_type::iterator p = d->by_key.find(key);
			if(p!=d->by_key.end()) {
				data::by_size_type::const_iterator p2 = p->second.find(1);
				if(p2!=p->second.end() && p2->second.child) 
				{
					throw cppcms_error(	"cppcms::url_mapper: ordinary url key `"+key+
								"can't be shared with mounted application key");
				}
			}
		}
		d->by_key[key][max_index] = e;
	}